

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O1

void pelelm_dermixfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                      Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  Box *pBVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Real RVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int n;
  long lVar30;
  long lVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  int local_188;
  int iStack_184;
  int local_108;
  int iStack_104;
  double local_e8 [23];
  
  if (!PeleLM::mixture_fraction_ready) {
    amrex::Abort_host("Mixture fraction not initialized");
  }
  RVar17 = PeleLM::Zox;
  pBVar1 = &(datfab->super_BaseFab<double>).domain;
  uVar15 = *(undefined8 *)(pBVar1->smallend).vect;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar25 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] + 1) -
                 (pBVar1->smallend).vect[0]);
  lVar22 = (((datfab->super_BaseFab<double>).domain.bigend.vect[1] + 1) -
           (datfab->super_BaseFab<double>).domain.smallend.vect[1]) * lVar25;
  lVar31 = (((datfab->super_BaseFab<double>).domain.bigend.vect[2] + 1) - iVar3) * lVar22;
  pBVar1 = &(derfab->super_BaseFab<double>).domain;
  lVar27 = ((long)(derfab->super_BaseFab<double>).domain.bigend.vect[0] + 1) -
           (long)(pBVar1->smallend).vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.bigend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  uVar16 = *(undefined8 *)(pBVar1->smallend).vect;
  pdVar13 = (derfab->super_BaseFab<double>).dptr;
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  pdVar14 = (datfab->super_BaseFab<double>).dptr;
  dVar33 = PeleLM::Zfu - PeleLM::Zox;
  memcpy(local_e8,&PeleLM::spec_Bilger_fact,0xa8);
  iVar7 = (bx->smallend).vect[2];
  iVar8 = (bx->bigend).vect[2];
  if (iVar7 <= iVar8) {
    iVar9 = (bx->bigend).vect[0];
    iVar10 = (bx->bigend).vect[1];
    iVar11 = (bx->smallend).vect[1];
    iVar12 = (bx->smallend).vect[0];
    local_188 = (int)uVar15;
    iStack_184 = (int)((ulong)uVar15 >> 0x20);
    local_108 = (int)uVar16;
    iStack_104 = (int)((ulong)uVar16 >> 0x20);
    do {
      if (iVar11 <= iVar10) {
        lVar18 = (long)iVar7;
        pdVar24 = (double *)
                  ((long)pdVar14 +
                  (lVar18 - iVar3) * lVar22 * 8 +
                  ((long)iVar11 - (long)iStack_184) * lVar25 * 8 + lVar31 * 8 + (long)iVar12 * 8 +
                  (long)local_188 * -8);
        lVar19 = (lVar18 - iVar6) * (((long)iVar4 + 1) - (long)iVar5) * lVar27;
        lVar23 = (long)iVar11;
        do {
          if (iVar12 <= iVar9) {
            lVar20 = (lVar23 - iStack_104) * lVar27;
            pdVar26 = pdVar24;
            lVar28 = (long)iVar12;
            do {
              dVar2 = pdVar14[(lVar18 - iVar3) * lVar22 +
                              (lVar23 - iStack_184) * lVar25 + (lVar28 - local_188)];
              lVar29 = lVar28 - local_108;
              pdVar13[lVar19 + lVar20 + lVar29] = 0.0;
              dVar34 = 0.0;
              lVar30 = 0;
              pdVar21 = pdVar26;
              do {
                dVar34 = dVar34 + *pdVar21 * local_e8[lVar30] * (1.0 / dVar2);
                pdVar13[lVar19 + lVar20 + lVar29] = dVar34;
                lVar30 = lVar30 + 1;
                pdVar21 = pdVar21 + lVar31;
              } while (lVar30 != 0x15);
              pdVar13[lVar19 + lVar20 + lVar29] = (dVar34 - RVar17) * (1.0 / dVar33);
              lVar28 = lVar28 + 1;
              pdVar26 = pdVar26 + 1;
            } while (iVar9 + 1 != (int)lVar28);
          }
          lVar23 = lVar23 + 1;
          pdVar24 = pdVar24 + lVar25;
        } while (iVar10 + 1 != (int)lVar23);
      }
      bVar32 = iVar7 != iVar8;
      iVar7 = iVar7 + 1;
    } while (bVar32);
  }
  return;
}

Assistant:

void pelelm_dermixfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == 1);

    if (!PeleLM::mixture_fraction_ready) amrex::Abort("Mixture fraction not initialized");

    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto       mixt_frac = derfab.array(0);

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx,
    [density, rhoY, mixt_frac, fact_lcl, Zox_lcl, denom_inv] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
    });
}